

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O0

void __thiscall soplex::SPxSteepPR<double>::addedVecs(SPxSteepPR<double> *this,int n)

{
  Type TVar1;
  int iVar2;
  double *pdVar3;
  long in_RDI;
  VectorBase<double> *unaff_retaddr;
  VectorBase<double> *weights;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar4;
  int local_c;
  long lVar5;
  
  lVar5 = in_RDI;
  local_c = VectorBase<double>::dim((VectorBase<double> *)0x2e55b0);
  SPxSolverBase<double>::coDim((SPxSolverBase<double> *)0x2e55ce);
  VectorBase<double>::reDim(unaff_retaddr,(int)((ulong)lVar5 >> 0x20),SUB81((ulong)lVar5 >> 0x18,0))
  ;
  TVar1 = SPxSolverBase<double>::type(*(SPxSolverBase<double> **)(in_RDI + 0x10));
  if (TVar1 == ENTER) {
    while (iVar4 = local_c, iVar2 = VectorBase<double>::dim((VectorBase<double> *)0x2e5606),
          iVar4 < iVar2) {
      pdVar3 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)CONCAT44(iVar4,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffcc);
      *pdVar3 = 2.0;
      local_c = local_c + 1;
    }
  }
  return;
}

Assistant:

void SPxSteepPR<R>::addedVecs(int n)
{
   VectorBase<R>& weights = this->thesolver->weights;
   n = weights.dim();
   weights.reDim(this->thesolver->coDim());

   if(this->thesolver->type() == SPxSolverBase<R>::ENTER)
   {
      for(; n < weights.dim(); ++n)
         weights[n] = 2;
   }
}